

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall
bloaty::Bloaty::ScanAndRollupFile
          (Bloaty *this,string *filename,Rollup *rollup,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out_build_ids)

{
  _Rb_tree_header *p_Var1;
  DataSource DVar2;
  InputFile *pIVar3;
  Arena *pAVar4;
  Arena *pAVar5;
  tuple<bloaty::RangeSink_*,_std::default_delete<bloaty::RangeSink>_> this_00;
  RangeSink *this_01;
  uint64_t uVar6;
  ObjectFile *file;
  Bloaty *filename_00;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  IVar7;
  DualMap *map;
  const_iterator cVar8;
  Arena *pAVar9;
  uint64_t uVar10;
  const_iterator cVar11;
  pointer __old_p;
  MessageLite MVar12;
  __pointer_type pSVar13;
  string_view name;
  string build_id;
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  sinks;
  DualMaps maps;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> filename_sink_ptrs;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> sink_ptrs;
  NameMunger empty_munger;
  undefined1 local_140 [16];
  key_type local_130;
  __pointer_type local_110;
  Arena *local_108;
  Arena *local_100;
  ObjectFile *local_f8;
  Arena *local_f0;
  Bloaty *local_e8;
  Arena *local_e0;
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  local_d8;
  DualMaps local_c0;
  Arena *local_a8;
  Arena *pAStack_a0;
  Rep *local_98;
  ArenaStringPtr local_88;
  undefined8 uStack_80;
  long local_78;
  string *local_70;
  string local_68;
  NameMunger local_48;
  
  local_110 = (__pointer_type)out_build_ids;
  local_108 = (Arena *)rollup;
  local_70 = filename;
  GetObjectFile((Bloaty *)local_140,(string *)this);
  DualMaps::DualMaps(&local_c0);
  local_d8.
  super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = 0;
  local_88.ptr_ = (string *)0x0;
  uStack_80._0_4_ = 0;
  uStack_80._4_4_ = 0;
  local_98 = (Rep *)0x0;
  local_a8 = (Arena *)0x0;
  pAStack_a0 = (Arena *)0x0;
  pIVar3 = (((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
            (local_140._0_8_ + 8))->_M_t).
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  IVar7.ptr_ = operator_new(0x118);
  *(InputFile **)IVar7.ptr_ = pIVar3;
  Options::Options((Options *)((long)IVar7.ptr_ + 8),&this->options_);
  *(undefined4 *)((long)IVar7.ptr_ + 0xe8) = 6;
  *(undefined8 *)((long)IVar7.ptr_ + 0xf0) = 0;
  *(undefined8 *)((long)IVar7.ptr_ + 0xf8) = 0;
  *(undefined8 *)((long)IVar7.ptr_ + 0x100) = 0;
  *(undefined8 *)((long)IVar7.ptr_ + 0x108) = 0;
  *(undefined8 *)((long)IVar7.ptr_ + 0x110) = 0;
  local_130._M_dataplus._M_p = (pointer)IVar7.ptr_;
  std::
  vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
  ::emplace_back<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>
            ((vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
              *)&local_d8,
             (unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)&local_130);
  std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::~unique_ptr
            ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)&local_130);
  local_48.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RangeSink::AddOutput
            ((RangeSink *)
             local_d8.
             super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>._M_t.
             super__Tuple_impl<0UL,_bloaty::RangeSink_*,_std::default_delete<bloaty::RangeSink>_>,
             (DualMap *)
             (((ArenaImpl *)
              &(local_c0.maps_.
                super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_t)->threads_)._M_b._M_p,&local_48);
  local_130._M_dataplus._M_p =
       *(pointer *)
        &local_d8.
         super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>._M_t.
         super__Tuple_impl<0UL,_bloaty::RangeSink_*,_std::default_delete<bloaty::RangeSink>_>;
  std::vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>>::
  emplace_back<bloaty::RangeSink*>
            ((vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>> *)&local_88,
             (RangeSink **)&local_130);
  pAVar9 = (Arena *)(this->sources_).
                    super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  local_f0 = (Arena *)(this->sources_).
                      super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = this;
  if (pAVar9 != local_f0) {
    do {
      pAVar4 = (Arena *)(pAVar9->impl_).threads_._M_b._M_p;
      pIVar3 = (((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                (local_140._0_8_ + 8))->_M_t).
               super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>.
               _M_t.
               super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
               super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
      pSVar13 = (((ArenaImpl *)
                 &(local_c0.maps_.
                   super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t)->threads_)._M_b._M_p;
      pAVar5 = (local_e8->arena_)._M_t.
               super___uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::Arena_*,_std::default_delete<google::protobuf::Arena>_>
               .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl;
      local_100 = pAVar9;
      IVar7.ptr_ = operator_new(0x118);
      DVar2 = *(DataSource *)&(pAVar4->impl_).hint_._M_b._M_p;
      *(InputFile **)IVar7.ptr_ = pIVar3;
      local_e0 = pAVar4;
      Options::Options((Options *)((long)IVar7.ptr_ + 8),&this->options_);
      *(DataSource *)((long)IVar7.ptr_ + 0xe8) = DVar2;
      *(__pointer_type *)((long)IVar7.ptr_ + 0xf0) = pSVar13;
      *(undefined8 *)((long)IVar7.ptr_ + 0xf8) = 0;
      *(undefined8 *)((long)IVar7.ptr_ + 0x100) = 0;
      *(undefined8 *)((long)IVar7.ptr_ + 0x108) = 0;
      *(Arena **)((long)IVar7.ptr_ + 0x110) = pAVar5;
      local_130._M_dataplus._M_p = (pointer)IVar7.ptr_;
      std::
      vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
      ::emplace_back<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>
                ((vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
                  *)&local_d8,
                 (unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)
                 &local_130);
      std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::~unique_ptr
                ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)
                 &local_130);
      this_00.super__Tuple_impl<0UL,_bloaty::RangeSink_*,_std::default_delete<bloaty::RangeSink>_>.
      super__Head_base<0UL,_bloaty::RangeSink_*,_false>._M_head_impl =
           local_d8.
           super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::RangeSink_*,_std::default_delete<bloaty::RangeSink>_>;
      map = DualMaps::AppendMap(&local_c0);
      pAVar9 = local_e0;
      RangeSink::AddOutput
                ((RangeSink *)
                 this_00.
                 super__Tuple_impl<0UL,_bloaty::RangeSink_*,_std::default_delete<bloaty::RangeSink>_>
                 .super__Head_base<0UL,_bloaty::RangeSink_*,_false>._M_head_impl,map,
                 (((unique_ptr<bloaty::NameMunger,_std::default_delete<bloaty::NameMunger>_> *)
                  &(local_e0->impl_).space_allocated_)->_M_t).
                 super___uniq_ptr_impl<bloaty::NameMunger,_std::default_delete<bloaty::NameMunger>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bloaty::NameMunger_*,_std::default_delete<bloaty::NameMunger>_>
                 .super__Head_base<0UL,_bloaty::NameMunger_*,_false>._M_head_impl);
      if (*(DataSource *)&(pAVar9->impl_).hint_._M_b._M_p == kInputFiles) {
        local_130._M_dataplus._M_p =
             *(pointer *)
              &local_d8.
               super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>.
               _M_t.
               super__Tuple_impl<0UL,_bloaty::RangeSink_*,_std::default_delete<bloaty::RangeSink>_>;
        std::vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>>::
        emplace_back<bloaty::RangeSink*>
                  ((vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>> *)&local_a8,
                   (RangeSink **)&local_130);
      }
      else {
        local_130._M_dataplus._M_p =
             *(pointer *)
              &local_d8.
               super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>.
               _M_t.
               super__Tuple_impl<0UL,_bloaty::RangeSink_*,_std::default_delete<bloaty::RangeSink>_>;
        std::vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>>::
        emplace_back<bloaty::RangeSink*>
                  ((vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>> *)&local_88,
                   (RangeSink **)&local_130);
      }
      pAVar9 = (Arena *)&(local_100->impl_).hint_;
    } while (pAVar9 != local_f0);
  }
  (*(*(_func_int ***)local_140._0_8_)[2])(&local_130);
  filename_00 = local_e8;
  if (local_130._M_string_length == 0) {
    MVar12._vptr_MessageLite = (_func_int **)0x0;
    pAVar9 = local_108;
  }
  else {
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(local_e8->debug_files_)._M_t,&local_130);
    if ((_Rb_tree_header *)cVar8._M_node ==
        &(filename_00->debug_files_)._M_t._M_impl.super__Rb_tree_header) {
      MVar12._vptr_MessageLite = (_func_int **)0x0;
    }
    else {
      GetObjectFile((Bloaty *)(local_140 + 8),(string *)filename_00);
      MVar12._vptr_MessageLite = (_func_int **)local_140._8_8_;
      ObjectFile::set_debug_file((ObjectFile *)local_140._0_8_,(ObjectFile *)local_140._8_8_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_110,&local_130);
    }
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(filename_00->sourcemap_files_)._M_t,&local_130);
    p_Var1 = &(filename_00->sourcemap_files_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar8._M_node == p_Var1) {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(filename_00->sourcemap_files_)._M_t,local_70);
    }
    pAVar9 = local_108;
    if ((_Rb_tree_header *)cVar8._M_node != p_Var1) {
      (**(code **)(*(long *)filename_00->file_factory_ + 0x10))
                (local_140 + 8,filename_00->file_factory_,cVar8._M_node + 2);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,local_130._M_dataplus._M_p,
                 local_130._M_dataplus._M_p + local_130._M_string_length);
      TryOpenSourceMapFile
                ((bloaty *)&local_f8,
                 (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                 (local_140 + 8),&local_68);
      file = local_f8;
      pAVar9 = local_108;
      local_f8 = (ObjectFile *)0x0;
      if (((ObjectFile *)MVar12._vptr_MessageLite != (ObjectFile *)0x0) &&
         ((**(code **)(*MVar12._vptr_MessageLite + 8))(MVar12._vptr_MessageLite),
         local_f8 != (ObjectFile *)0x0)) {
        (**(code **)(*(long *)local_f8 + 8))();
      }
      local_f8 = (ObjectFile *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      ObjectFile::set_debug_file((ObjectFile *)local_140._0_8_,file);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_110,&local_130);
      MVar12._vptr_MessageLite = (_func_int **)file;
      if ((ObjectFile *)local_140._8_8_ != (ObjectFile *)0x0) {
        (**(code **)(*(_func_int **)local_140._8_8_ + 0x10))();
      }
    }
  }
  local_110 = (pAVar9->impl_).hint_._M_b._M_p;
  local_f0 = (Arena *)(pAVar9->impl_).initial_block_;
  (*(*(_func_int ***)local_140._0_8_)[3])(local_140._0_8_,&local_88);
  local_100 = pAStack_a0;
  pAVar9 = local_a8;
  if (local_a8 != pAStack_a0) {
    do {
      this_01 = (RangeSink *)(pAVar9->impl_).threads_._M_b._M_p;
      pSVar13 = (((ArenaImpl *)
                 &(local_c0.maps_.
                   super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t)->threads_)._M_b._M_p;
      cVar11._M_node = (_Base_ptr)pSVar13->cleanup_;
      local_e0 = pAVar9;
      if ((_Rb_tree_header *)cVar11._M_node != (_Rb_tree_header *)&pSVar13->owner_) {
        do {
          uVar6 = *(uint64_t *)(cVar11._M_node + 1);
          uVar10 = RangeMap::RangeEndUnknownLimit((RangeMap *)pSVar13,cVar11,0xffffffffffffffff);
          RangeSink::AddVMRange
                    (this_01,"inputfile_vmcopier",uVar6,uVar10 - *(long *)(cVar11._M_node + 1),
                     &this_01->file_->filename_);
          cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
        } while ((_Rb_tree_header *)cVar11._M_node != (_Rb_tree_header *)&pSVar13->owner_);
        pSVar13 = (((ArenaImpl *)
                   &(local_c0.maps_.
                     super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t)->threads_)._M_b._M_p;
      }
      cVar11._M_node = (_Base_ptr)pSVar13[1].arena_;
      if (cVar11._M_node != (_Base_ptr)&pSVar13->cleanup_ptr_) {
        do {
          uVar6 = *(uint64_t *)(cVar11._M_node + 1);
          uVar10 = RangeMap::RangeEndUnknownLimit
                             ((RangeMap *)&pSVar13->limit_,cVar11,0xffffffffffffffff);
          name._M_str = (this_01->file_->filename_)._M_dataplus._M_p;
          name._M_len = (this_01->file_->filename_)._M_string_length;
          RangeSink::AddFileRange
                    (this_01,"inputfile_filecopier",name,uVar6,
                     uVar10 - *(long *)(cVar11._M_node + 1));
          cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
        } while (cVar11._M_node != (_Base_ptr)&pSVar13->cleanup_ptr_);
      }
      pAVar9 = (Arena *)&(local_e0->impl_).hint_;
    } while (pAVar9 != local_100);
  }
  pAVar9 = local_108;
  DualMaps::ComputeRollup(&local_c0,(Rollup *)local_108);
  if (((long)(pAVar9->impl_).hint_._M_b._M_p -
      ((long)&(local_f0->impl_).threads_._M_b._M_p + (long)local_110)) +
      (long)(pAVar9->impl_).initial_block_ !=
      (((((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
         (local_140._0_8_ + 8))->_M_t).
        super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
        super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
        super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl)->data_)._M_len) {
    __assert_fail("filesize == file->file_data().data().size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x71d,
                  "void bloaty::Bloaty::ScanAndRollupFile(const std::string &, Rollup *, std::vector<std::string> *) const"
                 );
  }
  if ((0 < verbose_level) || ((local_e8->options_).dump_raw_map_ == true)) {
    printf("Maps for %s:\n\n",(local_70->_M_dataplus)._M_p);
    if (show != 1) {
      puts("FILE MAP:");
      DualMaps::PrintFileMaps(&local_c0);
      if (show == 0) goto LAB_001890dd;
    }
    puts("VM MAP:");
    DualMaps::PrintVMMaps(&local_c0);
  }
LAB_001890dd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,(ulong)(local_130.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((ObjectFile *)MVar12._vptr_MessageLite != (ObjectFile *)0x0) {
    (*((ObjectFile *)MVar12._vptr_MessageLite)->_vptr_ObjectFile[1])(MVar12._vptr_MessageLite);
  }
  std::
  vector<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48.regexes_);
  if (local_a8 != (Arena *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  if (local_88.ptr_ != (string *)0x0) {
    operator_delete(local_88.ptr_,local_78 - (long)local_88.ptr_);
  }
  std::
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ::~vector(&local_d8);
  std::
  vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
  ::~vector(&local_c0.maps_);
  if ((ObjectFile *)local_140._0_8_ != (ObjectFile *)0x0) {
    (*(*(_func_int ***)local_140._0_8_)[1])();
  }
  return;
}

Assistant:

void Bloaty::ScanAndRollupFile(const std::string& filename, Rollup* rollup,
                               std::vector<std::string>* out_build_ids) const {
  auto file = GetObjectFile(filename);

  DualMaps maps;
  std::vector<std::unique_ptr<RangeSink>> sinks;
  std::vector<RangeSink*> sink_ptrs;
  std::vector<RangeSink*> filename_sink_ptrs;

  // Base map always goes first.
  sinks.push_back(absl::make_unique<RangeSink>(
      &file->file_data(), options_, DataSource::kSegments, nullptr, nullptr));
  NameMunger empty_munger;
  sinks.back()->AddOutput(maps.base_map(), &empty_munger);
  sink_ptrs.push_back(sinks.back().get());

  for (auto source : sources_) {
    sinks.push_back(absl::make_unique<RangeSink>(
        &file->file_data(), options_, source->effective_source, maps.base_map(),
        arena_.get()));
    sinks.back()->AddOutput(maps.AppendMap(), source->munger.get());
    // We handle the kInputFiles data source internally, without handing it off
    // to the file format implementation.  This seems slightly simpler, since
    // the file format has to deal with armembers too.
    if (source->effective_source == DataSource::kInputFiles) {
      filename_sink_ptrs.push_back(sinks.back().get());
    } else {
      sink_ptrs.push_back(sinks.back().get());
    }
  }

  std::unique_ptr<ObjectFile> debug_file;
  std::string build_id = file->GetBuildId();
  if (!build_id.empty()) {
    auto iter = debug_files_.find(build_id);
    if (iter != debug_files_.end()) {
      debug_file = GetObjectFile(iter->second);
      file->set_debug_file(debug_file.get());
      out_build_ids->push_back(build_id);
    }

    // Maybe it's a source map file?
    auto sourcemap_iter = sourcemap_files_.find(build_id);
    // If the source map by build id isn't found, try the file name.
    if (sourcemap_iter == sourcemap_files_.end()) {
      sourcemap_iter = sourcemap_files_.find(filename);
    }
    if (sourcemap_iter != sourcemap_files_.end()) {
      std::unique_ptr<InputFile> sourcemap_file(
          file_factory_.OpenFile(sourcemap_iter->second));
      // The build id is not present in the source map file itself, so it must
      // be passed here.
      debug_file = TryOpenSourceMapFile(sourcemap_file, build_id);
      file->set_debug_file(debug_file.get());
      out_build_ids->push_back(build_id);
    }
  }

  int64_t filesize_before =
      rollup->file_total() + rollup->filtered_file_total();
  file->ProcessFile(sink_ptrs);

  // kInputFile source: Copy the base map to the filename sink(s).
  for (auto sink : filename_sink_ptrs) {
    maps.base_map()->vm_map.ForEachRange(
        [sink](uint64_t start, uint64_t length) {
          sink->AddVMRange("inputfile_vmcopier", start, length,
                           sink->input_file().filename());
        });
    maps.base_map()->file_map.ForEachRange(
        [sink](uint64_t start, uint64_t length) {
          sink->AddFileRange("inputfile_filecopier",
                             sink->input_file().filename(), start, length);
        });
  }

  maps.ComputeRollup(rollup);

  // The ObjectFile implementation must guarantee this.
  int64_t filesize =
      rollup->file_total() + rollup->filtered_file_total() - filesize_before;
  (void)filesize;
  assert(filesize == file->file_data().data().size());

  if (verbose_level > 0 || options_.dump_raw_map()) {
    printf("Maps for %s:\n\n", filename.c_str());
    if (show != ShowDomain::kShowVM) {
      printf("FILE MAP:\n");
      maps.PrintFileMaps();
    }
    if (show != ShowDomain::kShowFile) {
      printf("VM MAP:\n");
      maps.PrintVMMaps();
    }
  }
}